

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O2

string * __thiscall
CoreML::Specification::Imputer::mutable_replacestringvalue_abi_cxx11_(Imputer *this)

{
  string *psVar1;
  
  if (this->_oneof_case_[1] != 0xd) {
    clear_ReplaceValue(this);
    this->_oneof_case_[1] = 0xd;
    (this->ReplaceValue_).replacedoublevalue_ =
         (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  psVar1 = google::protobuf::internal::ArenaStringPtr::MutableNoArena
                     (&(this->ReplaceValue_).replacestringvalue_,
                      (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  return psVar1;
}

Assistant:

inline ::std::string* Imputer::mutable_replacestringvalue() {
  if (!has_replacestringvalue()) {
    clear_ReplaceValue();
    set_has_replacestringvalue();
    ReplaceValue_.replacestringvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Imputer.replaceStringValue)
  return ReplaceValue_.replacestringvalue_.MutableNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
}